

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O3

uint FM_pass(Hypergraph *hypergraph,Partitionment *partitionment,uint max_diff)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  GainContainer gain_container;
  vector<bool,_std::allocator<bool>_> local_b0;
  GainedMove local_88;
  GainContainer local_78;
  
  std::vector<bool,_std::allocator<bool>_>::vector(&local_b0,&partitionment->partitionment_);
  GainContainer::GainContainer(&local_78,hypergraph,partitionment);
  if ((hypergraph->cells_).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (hypergraph->cells_).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    uVar3 = 0;
    uVar5 = 1;
    do {
      local_88 = GainContainer::getBestMove(&local_78,max_diff);
      GainContainer::update(&local_78,hypergraph,partitionment,local_88.first);
      Partitionment::doMove(partitionment,&local_88.first);
      uVar3 = uVar3 + local_88.second;
      if ((int)uVar4 < (int)uVar3) {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  (&local_b0,&partitionment->partitionment_);
        uVar4 = uVar3;
      }
      uVar2 = ((long)(hypergraph->cells_).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(hypergraph->cells_).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      bVar6 = uVar5 <= uVar2;
      lVar1 = uVar2 - uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar6 && lVar1 != 0);
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)partitionment);
  (partitionment->partitionment_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage =
       local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  (partitionment->partitionment_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  *(ulong *)&(partitionment->partitionment_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
       CONCAT44(local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._12_4_,
                local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_offset);
  (partitionment->partitionment_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p;
  *(ulong *)&(partitionment->partitionment_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
       CONCAT44(local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._12_4_,
                local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_offset);
  local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  if (local_78.num_cells_in_partitions_.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.num_cells_in_partitions_.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.num_cells_in_partitions_.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.num_cells_in_partitions_.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<GainBuckets,_std::allocator<GainBuckets>_>::~vector(&local_78.buckets_);
  if (local_78.cell_states_.
      super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.cell_states_.
                    super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.cell_states_.
                          super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.cell_states_.
                          super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return uVar4;
}

Assistant:

unsigned FM_pass(const Hypergraph &hypergraph, Partitionment &partitionment, unsigned max_diff) {
  unsigned best_cost_reduction = 0;
  Partitionment best_partitionment(partitionment);
  GainContainer gain_container(hypergraph, partitionment);
  int cur_cost_reduction = 0;
  for (unsigned i = 0; i < hypergraph.getCells().size(); ++i) {
    auto [move, gain] = gain_container.getBestMove(max_diff);
    gain_container.update(hypergraph, partitionment, move);
    partitionment.doMove(move);
    cur_cost_reduction += gain;
    if (cur_cost_reduction > (int)best_cost_reduction) {
      best_cost_reduction = (unsigned)cur_cost_reduction;
      best_partitionment = partitionment;
    }
  }
  partitionment = std::move(best_partitionment);
  return best_cost_reduction;
}